

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamWriter.h
# Opt level: O3

void __thiscall
Assimp::StreamWriter<false,_false>::PutString(StreamWriter<false,_false> *this,string *s)

{
  size_t sVar1;
  size_t __n;
  pointer puVar2;
  
  sVar1 = this->cursor;
  __n = s->_M_string_length;
  puVar2 = (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2) <= __n + sVar1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->buffer,__n + sVar1);
    puVar2 = (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    sVar1 = this->cursor;
    __n = s->_M_string_length;
  }
  memcpy(puVar2 + sVar1,(s->_M_dataplus)._M_p,__n);
  this->cursor = this->cursor + s->_M_string_length;
  return;
}

Assistant:

void PutString(const std::string& s)
    {
        // as Put(T f) below
        if (cursor + s.size() >= buffer.size()) {
            buffer.resize(cursor + s.size());
        }
        void* dest = &buffer[cursor];
        ::memcpy(dest, s.c_str(), s.size());
        cursor += s.size();
    }